

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerStSlotChkUndecl(Lowerer *this,Instr *instrStSlot)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  Instr *instrInsert;
  Instr *instr;
  Opnd *dstOpnd;
  Instr *instrStSlot_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc2(instrStSlot);
  if (pOVar3 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b6e,"(instrStSlot->GetSrc2() != nullptr)",
                       "instrStSlot->GetSrc2() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IR::Instr::FreeSrc2(instrStSlot);
  pOVar3 = IR::Instr::GetDst(instrStSlot);
  pOVar3 = CreateOpndForSlotAccess(this,pOVar3);
  instrInsert = LowerStSlot(this,instrStSlot);
  GenUndeclChk(this,instrInsert,pOVar3);
  return instrInsert;
}

Assistant:

IR::Instr *
Lowerer::LowerStSlotChkUndecl(IR::Instr *instrStSlot)
{
    Assert(instrStSlot->GetSrc2() != nullptr);

    // Src2 is required only to avoid dead store false positives during GlobOpt.
    instrStSlot->FreeSrc2();

    IR::Opnd *dstOpnd = this->CreateOpndForSlotAccess(instrStSlot->GetDst());
    IR::Instr *instr = this->LowerStSlot(instrStSlot);

    this->GenUndeclChk(instr, dstOpnd);

    return instr;
}